

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

void __thiscall
llvm::SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer(SmallVectorMemoryBuffer *this)

{
  (this->super_MemoryBuffer)._vptr_MemoryBuffer =
       (_func_int **)&PTR__SmallVectorMemoryBuffer_01128e00;
  std::__cxx11::string::~string((string *)&this->BufferName);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&this->SV);
  return;
}

Assistant:

SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer() {}